

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O2

void __thiscall GYMPlayer::CalcSongLength(GYMPlayer *this)

{
  byte bVar1;
  UINT32 UVar2;
  uint uVar3;
  UINT32 UVar4;
  bool bVar5;
  
  this->_totalTicks = 0;
  this->_loopOfs = 0;
  uVar3 = (this->_fileHdr).dataOfs;
  UVar2 = (this->_fileHdr).loopFrame;
  UVar4 = 0;
LAB_0010f82c:
LAB_0010f83c:
  do {
    bVar5 = false;
    while( true ) {
      if ((bVar5) || (this->_fileLen <= uVar3)) {
        return;
      }
      if (UVar4 == UVar2 && UVar2 != 0) {
        this->_loopOfs = uVar3;
      }
      bVar1 = this->_fileData[uVar3];
      if (bVar1 - 1 < 2) {
        uVar3 = uVar3 + 3;
        goto LAB_0010f83c;
      }
      if (bVar1 == 3) break;
      uVar3 = uVar3 + 1;
      bVar5 = true;
      if (bVar1 == 0) {
        UVar4 = UVar4 + 1;
        this->_totalTicks = UVar4;
        goto LAB_0010f82c;
      }
    }
    uVar3 = uVar3 + 2;
  } while( true );
}

Assistant:

void GYMPlayer::CalcSongLength(void)
{
	UINT32 filePos;
	bool fileEnd;
	UINT8 curCmd;
	
	_totalTicks = 0;
	_loopOfs = 0;
	
	fileEnd = false;
	filePos = _fileHdr.dataOfs;
	while(! fileEnd && filePos < _fileLen)
	{
		if (_totalTicks == _fileHdr.loopFrame && _fileHdr.loopFrame != 0)
			_loopOfs = filePos;
		
		curCmd = _fileData[filePos];
		filePos ++;
		switch(curCmd)
		{
		case 0x00:	// wait 1 frame
			_totalTicks ++;
			break;
		case 0x01:
		case 0x02:
			filePos += 0x02;
			break;
		case 0x03:
			filePos += 0x01;
			break;
		default:
			fileEnd = true;
			break;
		}
	}
	
	return;
}